

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::TexImageCubeAlignCase::createTexture(TexImageCubeAlignCase *this)

{
  ContextWrapper *this_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int level;
  int local_b0;
  deUint32 tex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  TextureFormat fmt;
  Vec4 colorB;
  Vec4 colorA;
  PixelBufferAccess local_58;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  local_b0 = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar6 = (this->super_TextureSpecCase).m_width;
    uVar1 = 0x20;
    uVar3 = 0x20;
    if (uVar6 != 0) {
      uVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    uVar6 = (this->super_TextureSpecCase).m_height;
    if (uVar6 != 0) {
      uVar1 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar1 = uVar1 ^ 0x1f;
    }
    local_b0 = 0x1f - uVar1;
    if ((int)(0x1f - uVar1) < (int)(0x1f - uVar3)) {
      local_b0 = 0x1f - uVar3;
    }
    local_b0 = local_b0 + 1;
  }
  tex = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  if (0 < local_b0) {
    level = 0;
    do {
      uVar6 = (this->super_TextureSpecCase).m_width >> ((byte)level & 0x1f);
      if ((int)uVar6 < 2) {
        uVar6 = 1;
      }
      uVar3 = (this->super_TextureSpecCase).m_height >> ((byte)level & 0x1f);
      if ((int)uVar3 < 2) {
        uVar3 = 1;
      }
      iVar4 = this->m_alignment;
      iVar2 = tcu::TextureFormat::getPixelSize(&fmt);
      iVar4 = (((int)(iVar2 * uVar6) / iVar4 + 1) - (uint)((int)(iVar2 * uVar6) % iVar4 == 0)) *
              iVar4;
      uVar1 = uVar3 >> 2;
      if (uVar6 >> 2 < uVar3 >> 2) {
        uVar1 = uVar6 >> 2;
      }
      colorA.m_data[0] = 1.0;
      colorA.m_data[1] = 0.0;
      colorA.m_data[2] = 0.0;
      colorA.m_data[3] = 1.0;
      if (uVar1 < 2) {
        uVar1 = 1;
      }
      colorB.m_data[0] = 0.0;
      colorB.m_data[1] = 1.0;
      colorB.m_data[2] = 0.0;
      colorB.m_data[3] = 1.0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&data,(long)(int)(iVar4 * uVar3));
      tcu::PixelBufferAccess::PixelBufferAccess
                (&local_58,&fmt,uVar6,uVar3,1,iVar4,0,
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      tcu::fillWithGrid(&local_58,uVar1,&colorA,&colorB);
      lVar5 = 0;
      do {
        sglr::ContextWrapper::glTexImage2D
                  (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar5),level,this->m_format,uVar6,
                   uVar3,0,this->m_format,this->m_dataType,
                   data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x18);
      level = level + 1;
    } while (level != local_b0);
  }
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		vector<deUint8>		data;

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			int		rowPitch	= getRowPitch(fmt, levelW, m_alignment);
			Vec4	colorA		(1.0f, 0.0f, 0.0f, 1.0f);
			Vec4	colorB		(0.0f, 1.0f, 0.0f, 1.0f);
			int		cellSize	= de::max(1, de::min(levelW >> 2, levelH >> 2));

			data.resize(rowPitch*levelH);
			tcu::fillWithGrid(tcu::PixelBufferAccess(fmt, levelW, levelH, 1, rowPitch, 0, &data[0]), cellSize, colorA, colorB);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, &data[0]);
		}
	}